

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void in2_r2_nz(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int reg;
  TCGv_i64 pTVar1;
  int r2;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = get_field1(s,FLD_O_r2,FLD_C_b2);
  if (reg != 0) {
    pTVar1 = load_reg(tcg_ctx_00,reg);
    o->in2 = pTVar1;
  }
  return;
}

Assistant:

static void in2_r2_nz(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r2 = get_field(s, r2);
    if (r2 != 0) {
        o->in2 = load_reg(tcg_ctx, r2);
    }
}